

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

void wipefile(char *aFilename)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  stat st;
  
  iVar1 = stat(aFilename,(stat *)&st);
  if (iVar1 == 0) {
    __stream = fopen(aFilename,"w");
    if (__stream != (FILE *)0x0) {
      lVar2 = 0;
      if (0 < st.st_size) {
        lVar2 = st.st_size;
      }
      while (lVar2 != 0) {
        fputc(0x41,__stream);
        lVar2 = lVar2 + -1;
      }
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

static void wipefile(char const * const aFilename)
{
        int i;
        struct stat st;
        FILE * lIn;

        if (stat(aFilename, &st) == 0)
        {
                if ((lIn = fopen(aFilename, "w")))
                {
                        for (i = 0; i < st.st_size; i++)
                        {
                                fputc('A', lIn);
                        }
                }
                fclose(lIn);
        }
}